

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create_sequence_info.cpp
# Opt level: O3

void __thiscall duckdb::CreateSequenceInfo::CreateSequenceInfo(CreateSequenceInfo *this)

{
  char *__end;
  string local_60;
  string local_40;
  
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,anon_var_dwarf_643837b + 9,anon_var_dwarf_643837b + 9);
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_60,anon_var_dwarf_643837b + 9,anon_var_dwarf_643837b + 9);
  CreateInfo::CreateInfo(&this->super_CreateInfo,SEQUENCE_ENTRY,&local_40,&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  (this->super_CreateInfo).super_ParseInfo._vptr_ParseInfo =
       (_func_int **)&PTR__CreateSequenceInfo_019862b0;
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  (this->name)._M_string_length = 0;
  (this->name).field_2._M_local_buf[0] = '\0';
  this->usage_count = 0;
  this->increment = 1;
  this->min_value = 1;
  this->max_value = 0x7fffffffffffffff;
  this->start_value = 1;
  this->cycle = false;
  return;
}

Assistant:

CreateSequenceInfo::CreateSequenceInfo()
    : CreateInfo(CatalogType::SEQUENCE_ENTRY, INVALID_SCHEMA), name(string()), usage_count(0), increment(1),
      min_value(1), max_value(NumericLimits<int64_t>::Maximum()), start_value(1), cycle(false) {
}